

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O1

void decode_rle(u8 *src,size_t src_size,u8 *dst,u8 *dst_end)

{
  byte bVar1;
  u32 uVar2;
  byte bVar3;
  byte *__s;
  byte *local_38;
  
  if (src_size == 0) {
    local_38 = src;
    __assert_fail("src_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",
                  0xa9,"void decode_rle(const u8 *, size_t, u8 *, u8 *)");
  }
  local_38 = src + 1;
  bVar3 = *src;
  *dst = bVar3;
  __s = dst + 1;
  if (1 < (long)src_size) {
    do {
      bVar1 = *local_38;
      if (bVar1 == bVar3) {
        local_38 = local_38 + 1;
        uVar2 = read_varint(&local_38);
        memset(__s,(uint)bVar3,(ulong)(uVar2 + 1));
        __s = __s + uVar2;
      }
      else {
        *__s = bVar1;
        bVar3 = bVar1;
        local_38 = local_38 + 1;
      }
      __s = __s + 1;
    } while (local_38 < src + src_size);
  }
  if (__s == dst_end) {
    return;
  }
  __assert_fail("dst == dst_end",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",0xab
                ,"void decode_rle(const u8 *, size_t, u8 *, u8 *)");
}

Assistant:

static void decode_rle(const u8* src, size_t src_size, u8* dst, u8* dst_end) {
#define WRITE(x) *dst++ = (x)
  DECODE_RLE(WRITE, src, src_size);
#undef WRITE
  assert(dst == dst_end);
}